

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * valueAsString<bool>(string *__return_storage_ptr__,bool value)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  
  pcVar1 = "FALSE";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    pcVar1 = "TRUE";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (CONCAT71(in_register_00000031,value) & 0xffffffff ^ 5));
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<bool>(bool value)
{
  return value ? "TRUE" : "FALSE";
}